

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Vec_Int_t * Saig_RefManFindReason(Saig_RefMan_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  int *piVar3;
  Abc_Cex_t *pAVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  Vec_Int_t *vPrios;
  int *piVar9;
  long lVar10;
  Vec_Int_t *vReasons;
  int iVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  Aig_Obj_t *pObj;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  Aig_Man_t *pAVar21;
  
  iVar14 = p->pAig->nTruePis;
  iVar16 = iVar14;
  if (iVar14 - 1U < 0xf) {
    iVar16 = 0x10;
  }
  if ((iVar16 == 0) || (pvVar8 = malloc((long)iVar16 << 2), pvVar8 == (void *)0x0)) {
    pvVar8 = (void *)0x0;
  }
  else {
    memset(pvVar8,0xff,(long)iVar14 * 4);
  }
  pAVar21 = p->pFrames;
  uVar2 = pAVar21->vObjs->nSize;
  vPrios = (Vec_Int_t *)malloc(0x10);
  uVar19 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar19 = uVar2;
  }
  vPrios->nCap = uVar19;
  if (uVar19 == 0) {
    vPrios->pArray = (int *)0x0;
    vPrios->nSize = uVar2;
LAB_00614693:
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar19 << 2);
    vPrios->pArray = piVar9;
    vPrios->nSize = uVar2;
    if (piVar9 == (int *)0x0) goto LAB_00614693;
    memset(piVar9,0xff,(long)(int)uVar2 << 2);
  }
  puVar1 = &pAVar21->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pAVar21 = p->pFrames;
  pVVar13 = pAVar21->vCis;
  if (pVVar13->nSize < 1) {
    if (pvVar8 == (void *)0x0) goto LAB_0061478e;
  }
  else {
    lVar10 = 0;
    lVar15 = 0;
    iVar16 = 0;
    do {
      uVar19 = p->vMapPiF2A->nSize;
      if (((int)uVar19 <= lVar10) || ((ulong)uVar19 <= lVar10 + 1U)) goto LAB_0061499a;
      piVar3 = p->vMapPiF2A->pArray;
      pAVar4 = p->pCex;
      uVar19 = piVar3[lVar10];
      iVar11 = pAVar4->nRegs + uVar19 + pAVar4->nPis * piVar3[lVar10 + 1];
      lVar5 = *(long *)((long)pVVar13->pArray + lVar10 * 4);
      *(ulong *)(lVar5 + 0x18) =
           (*(ulong *)(lVar5 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((uint)(&pAVar4[1].iPo)[iVar11 >> 5] >> ((byte)iVar11 & 0x1f) & 1) * 8;
      if (((int)uVar19 < 0) || (iVar14 <= (int)uVar19)) goto LAB_0061499a;
      if (*(int *)((long)pvVar8 + (ulong)uVar19 * 4) == -1) {
        *(int *)((long)pvVar8 + (ulong)uVar19 * 4) = iVar16;
        iVar16 = iVar16 + 1;
      }
      iVar11 = *(int *)(lVar5 + 0x24);
      if (((long)iVar11 < 0) || ((int)uVar2 <= iVar11)) goto LAB_006149b9;
      piVar9[iVar11] = (int)lVar15;
      lVar15 = lVar15 + 1;
      pAVar21 = p->pFrames;
      pVVar13 = pAVar21->vCis;
      lVar10 = lVar10 + 2;
    } while (lVar15 < pVVar13->nSize);
  }
  free(pvVar8);
LAB_0061478e:
  pVVar13 = pAVar21->vObjs;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      pvVar8 = pVVar13->pArray[lVar10];
      if ((pvVar8 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar8 + 0x18) & 7) - 7))
      {
        uVar6 = *(ulong *)((long)pvVar8 + 8);
        if (uVar6 == 0) {
LAB_0061499a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar14 = *(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
        if ((((long)iVar14 < 0) || ((int)uVar2 <= iVar14)) ||
           (uVar7 = *(ulong *)((long)pvVar8 + 0x10), uVar7 == 0)) goto LAB_0061499a;
        uVar19 = *(uint *)((uVar7 & 0xfffffffffffffffe) + 0x24);
        if (((long)(int)uVar19 < 0) || (uVar2 <= uVar19)) goto LAB_0061499a;
        uVar17 = (uint)uVar6 & 1;
        uVar18 = *(uint *)((uVar6 & 0xfffffffffffffffe) + 0x18) >> 3 & 1;
        iVar14 = piVar9[iVar14];
        iVar16 = piVar9[(int)uVar19];
        uVar19 = *(uint *)((uVar7 & 0xfffffffffffffffe) + 0x18) >> 3 ^ (uint)uVar7;
        bVar20 = (byte)uVar19 & uVar17 != uVar18;
        *(ulong *)((long)pvVar8 + 0x18) =
             (*(ulong *)((long)pvVar8 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar20 * 8;
        if (bVar20 == 1) {
          uVar12 = *(uint *)((long)pvVar8 + 0x24);
          if (((int)uVar12 < 0) || (uVar2 <= uVar12)) {
LAB_006149b9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          if (iVar14 <= iVar16) {
            iVar14 = iVar16;
          }
        }
        else {
          uVar19 = uVar19 & 1;
          if ((uVar17 == uVar18) && (uVar19 != 0)) {
            uVar12 = *(uint *)((long)pvVar8 + 0x24);
            if (((int)uVar12 < 0) || (uVar2 <= uVar12)) goto LAB_006149b9;
          }
          else {
            uVar12 = *(uint *)((long)pvVar8 + 0x24);
            if ((uVar17 == uVar18) || (uVar19 != 0)) {
              if (uVar2 <= uVar12 || (int)uVar12 < 0) goto LAB_006149b9;
              if (iVar16 <= iVar14) {
                iVar14 = iVar16;
              }
            }
            else {
              iVar14 = iVar16;
              if (uVar2 <= uVar12 || (int)uVar12 < 0) goto LAB_006149b9;
            }
          }
        }
        piVar9[uVar12] = iVar14;
      }
      lVar10 = lVar10 + 1;
      pAVar21 = p->pFrames;
      pVVar13 = pAVar21->vObjs;
    } while (lVar10 < pVVar13->nSize);
  }
  if (pAVar21->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar8 = *pAVar21->vCos->pArray;
  uVar6 = *(ulong *)((long)pvVar8 + 8);
  if ((((uint)uVar6 ^ *(uint *)((uVar6 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
    __assert_fail("(int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0xd5,"Vec_Int_t *Saig_RefManFindReason(Saig_RefMan_t *)");
  }
  vReasons = (Vec_Int_t *)malloc(0x10);
  vReasons->nCap = 100;
  vReasons->nSize = 0;
  piVar9 = (int *)malloc(400);
  vReasons->pArray = piVar9;
  Aig_ManIncrementTravId(pAVar21);
  pObj = (Aig_Obj_t *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe);
  if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
    Saig_RefManFindReason_rec(p->pFrames,pObj,vPrios,vReasons);
  }
  if (vPrios->pArray != (int *)0x0) {
    free(vPrios->pArray);
  }
  free(vPrios);
  return vReasons;
}

Assistant:

Vec_Int_t * Saig_RefManFindReason( Saig_RefMan_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vPi2Prio, * vReasons;
    int i, CountPrios;

    vPi2Prio = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    vPrios   = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );

    // set PI values according to CEX
    CountPrios = 0;
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // assign priority
        if ( Vec_IntEntry(vPi2Prio, iInput) == ~0 )
            Vec_IntWriteEntry( vPi2Prio, iInput, CountPrios++ );
//        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Vec_IntEntry(vPi2Prio, iInput) );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }
//    printf( "Priority numbers = %d.\n", CountPrios );
    Vec_IntFree( vPi2Prio );

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    assert( (int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj) );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        Saig_RefManFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
    return vReasons;
}